

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DestroyDB(leveldb *this,string *dbname,Options *options)

{
  Env *pEVar1;
  Status SVar2;
  bool bVar3;
  char *pcVar4;
  reference pvVar5;
  Status local_f8;
  Status local_f0;
  Status local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  Status local_a0;
  Status del;
  size_t i;
  FileType type;
  uint64_t number;
  undefined1 local_78 [8];
  string lockname;
  FileLock *lock;
  Status local_48;
  Status result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  Env *env;
  Options *options_local;
  string *dbname_local;
  
  pEVar1 = options->env;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&result);
  (*pEVar1->_vptr_Env[7])(&local_48,pEVar1,dbname,&result);
  bVar3 = Status::ok(&local_48);
  if (bVar3) {
    LockFileName((string *)local_78,dbname);
    (*pEVar1->_vptr_Env[0xf])(&number,pEVar1,local_78,(undefined1 *)((long)&lockname.field_2 + 8));
    Status::operator=(&local_48,(Status *)&number);
    Status::~Status((Status *)&number);
    bVar3 = Status::ok(&local_48);
    if (bVar3) {
      for (del.state_ = (char *)0x0; SVar2.state_ = del.state_,
          pcVar4 = (char *)std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&result), SVar2.state_ < pcVar4; del.state_ = del.state_ + 1) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&result,(size_type)del.state_);
        bVar3 = ParseFileName(pvVar5,(uint64_t *)&stack0xffffffffffffff78,(FileType *)((long)&i + 4)
                             );
        if ((bVar3) && (i._4_4_ != 1)) {
          std::operator+(&local_e0,dbname,"/");
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&result,(size_type)del.state_);
          std::operator+(&local_c0,&local_e0,pvVar5);
          (*pEVar1->_vptr_Env[8])(&local_a0,pEVar1,&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
          std::__cxx11::string::~string((string *)&local_e0);
          bVar3 = Status::ok(&local_48);
          if ((bVar3) && (bVar3 = Status::ok(&local_a0), !bVar3)) {
            Status::operator=(&local_48,&local_a0);
          }
          Status::~Status(&local_a0);
        }
      }
      (*pEVar1->_vptr_Env[0x10])(&local_e8,pEVar1,lockname.field_2._8_8_);
      Status::~Status(&local_e8);
      (*pEVar1->_vptr_Env[8])(&local_f0,pEVar1,local_78);
      Status::~Status(&local_f0);
      (*pEVar1->_vptr_Env[0xb])(&local_f8,pEVar1,dbname);
      Status::~Status(&local_f8);
    }
    Status::Status((Status *)this,&local_48);
    std::__cxx11::string::~string((string *)local_78);
  }
  else {
    Status::OK();
  }
  Status::~Status(&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&result);
  return (Status)(char *)this;
}

Assistant:

Status DestroyDB(const std::string& dbname, const Options& options) {
  Env* env = options.env;
  std::vector<std::string> filenames;
  Status result = env->GetChildren(dbname, &filenames);
  if (!result.ok()) {
    // Ignore error in case directory does not exist
    return Status::OK();
  }

  FileLock* lock;
  const std::string lockname = LockFileName(dbname);
  result = env->LockFile(lockname, &lock);
  if (result.ok()) {
    uint64_t number;
    FileType type;
    for (size_t i = 0; i < filenames.size(); i++) {
      if (ParseFileName(filenames[i], &number, &type) &&
          type != kDBLockFile) {  // Lock file will be deleted at end
        Status del = env->RemoveFile(dbname + "/" + filenames[i]);
        if (result.ok() && !del.ok()) {
          result = del;
        }
      }
    }
    env->UnlockFile(lock);  // Ignore error since state is already gone
    env->RemoveFile(lockname);
    env->RemoveDir(dbname);  // Ignore error in case dir contains other files
  }
  return result;
}